

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int compare_dir_entries(void *p1,void *p2)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  
  pcVar7 = "na";
  if (*(char **)(*p1 + 0x20) != (char *)0x0) {
    pcVar7 = *(char **)(*p1 + 0x20);
  }
  if ((*(uint *)((long)p1 + 0x28) & 0xf000) == 0x4000) {
    if ((*(uint *)((long)p2 + 0x28) & 0xf000) != 0x4000) {
      return -1;
    }
  }
  else if ((*(uint *)((long)p2 + 0x28) & 0xf000) == 0x4000) {
    return 1;
  }
  cVar1 = *pcVar7;
  if (cVar1 == 'd') {
    lVar2 = *(long *)((long)p1 + 0x68);
    lVar3 = *(long *)((long)p2 + 0x68);
    bVar9 = SBORROW8(lVar2,lVar3);
    lVar4 = lVar2 - lVar3;
    bVar8 = lVar2 == lVar3;
  }
  else {
    if (cVar1 != 's') {
      iVar5 = 0;
      if (cVar1 == 'n') {
        iVar5 = strcmp(*(char **)((long)p1 + 8),*(char **)((long)p2 + 8));
      }
      goto LAB_0010aaa1;
    }
    lVar2 = *(long *)((long)p1 + 0x40);
    lVar3 = *(long *)((long)p2 + 0x40);
    bVar9 = SBORROW8(lVar2,lVar3);
    lVar4 = lVar2 - lVar3;
    bVar8 = lVar2 == lVar3;
  }
  bVar9 = !bVar8 && bVar9 == lVar4 < 0;
  iVar5 = (bVar9 - 1) + (uint)bVar9;
  if (bVar8) {
    iVar5 = 0;
  }
LAB_0010aaa1:
  iVar6 = -iVar5;
  if (pcVar7[1] != 'd') {
    iVar6 = iVar5;
  }
  return iVar6;
}

Assistant:

static int __cdecl compare_dir_entries(const void *p1, const void *p2) {
  const struct dir_entry *a = (const struct dir_entry *) p1,
        *b = (const struct dir_entry *) p2;
  const char *qs = a->conn->mg_conn.query_string ?
    a->conn->mg_conn.query_string : "na";
  int cmp_result = 0;

  if (S_ISDIR(a->st.st_mode) && !S_ISDIR(b->st.st_mode)) {
    return -1;  // Always put directories on top
  } else if (!S_ISDIR(a->st.st_mode) && S_ISDIR(b->st.st_mode)) {
    return 1;   // Always put directories on top
  } else if (*qs == 'n') {
    cmp_result = strcmp(a->file_name, b->file_name);
  } else if (*qs == 's') {
    cmp_result = a->st.st_size == b->st.st_size ? 0 :
      a->st.st_size > b->st.st_size ? 1 : -1;
  } else if (*qs == 'd') {
    cmp_result = a->st.st_mtime == b->st.st_mtime ? 0 :
      a->st.st_mtime > b->st.st_mtime ? 1 : -1;
  }

  return qs[1] == 'd' ? -cmp_result : cmp_result;
}